

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

uint32 get32(vorb *f)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint32 x;
  vorb *in_stack_ffffffffffffffe8;
  
  bVar1 = get8(in_stack_ffffffffffffffe8);
  bVar2 = get8(in_stack_ffffffffffffffe8);
  bVar3 = get8(in_stack_ffffffffffffffe8);
  bVar4 = get8(in_stack_ffffffffffffffe8);
  return (uint)bVar4 * 0x1000000 + (uint)bVar3 * 0x10000 + (uint)bVar2 * 0x100 + (uint)bVar1;
}

Assistant:

static uint32 get32(vorb *f)
{
   uint32 x;
   x = get8(f);
   x += get8(f) << 8;
   x += get8(f) << 16;
   x += (uint32) get8(f) << 24;
   return x;
}